

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

void absl::cord_internal::anon_unknown_0::DumpAll
               (CordRep *rep,bool include_contents,ostream *stream,size_t depth)

{
  byte bVar1;
  ostream *poVar2;
  CordRepBtree *pCVar3;
  CordRepSubstring *pCVar4;
  CordRepFlat *this;
  AlphaNum *in_R8;
  long lVar5;
  anon_class_16_2_6856332a maybe_dump_data;
  string label;
  string_view local_100;
  undefined1 local_f0 [32];
  string sharing;
  string sptr;
  undefined1 local_90 [48];
  AlphaNum local_60;
  
  if (0xe < depth) {
    __assert_fail("depth <= CordRepBtree::kMaxDepth + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x40,
                  "void absl::cord_internal::(anonymous namespace)::DumpAll(const CordRep *, bool, std::ostream &, size_t)"
                 );
  }
  if ((rep->refcount).count_.super___atomic_base<int>._M_i == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sharing,"Private",(allocator<char> *)&sptr);
  }
  else {
    local_100 = NullSafeStringView("Shared(");
    AlphaNum::AlphaNum(&local_60,(long)((rep->refcount).count_.super___atomic_base<int>._M_i >> 1));
    local_90._0_16_ = (undefined1  [16])NullSafeStringView(")");
    StrCat_abi_cxx11_(&sharing,(absl *)&local_100,&local_60,(AlphaNum *)local_90,in_R8);
  }
  local_100 = NullSafeStringView("0x");
  label._M_string_length._0_2_ = 0x3001;
  local_90._16_8_ = 0;
  local_90[0x18] = '\0';
  local_90[0x19] = '\0';
  local_90[0x1a] = '\0';
  local_90[0x1b] = '\0';
  local_90[0x1c] = '\0';
  local_90[0x1d] = '\0';
  local_90[0x1e] = '\0';
  local_90[0x1f] = '\0';
  local_90._8_8_ = 0;
  local_90._0_8_ = local_90 + 0x10;
  label._M_dataplus._M_p = (pointer)rep;
  local_60.piece_ =
       strings_internal::ExtractStringification<absl::Hex>((StringifySink *)local_90,(Hex *)&label);
  StrCat_abi_cxx11_(&sptr,(absl *)&local_100,&local_60,&local_60);
  std::__cxx11::string::_M_dispose();
  local_100._M_len = (size_t)local_f0;
  maybe_dump_data.stream = stream;
  maybe_dump_data.include_contents = include_contents;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)depth * '\x02');
  poVar2 = std::operator<<(stream,(string *)&local_100);
  poVar2 = std::operator<<(poVar2,(string *)&sharing);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,(string *)&sptr);
  std::operator<<(poVar2,") ");
  std::__cxx11::string::_M_dispose();
  bVar1 = rep->tag;
  if (bVar1 == 1) {
    pCVar4 = CordRep::substring(rep);
    poVar2 = std::operator<<(stream,"Substring, len = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", start = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    DumpAll::anon_class_16_2_6856332a::operator()(&maybe_dump_data,rep);
    DumpAll(pCVar4->child,include_contents,stream,depth + 1);
  }
  else if (bVar1 == 3) {
    pCVar3 = CordRep::btree(rep);
    if ((pCVar3->super_CordRep).storage[0] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&label,"Leaf",(allocator<char> *)&local_100);
    }
    else {
      local_100 = NullSafeStringView("Node(");
      AlphaNum::AlphaNum(&local_60,(uint)(pCVar3->super_CordRep).storage[0]);
      local_90._0_16_ = (undefined1  [16])NullSafeStringView(")");
      StrCat_abi_cxx11_(&label,(absl *)&local_100,&local_60,(AlphaNum *)local_90,in_R8);
    }
    poVar2 = std::operator<<(stream,(string *)&label);
    poVar2 = std::operator<<(poVar2,", len = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", begin = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", end = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    bVar1 = (pCVar3->super_CordRep).storage[2];
    for (lVar5 = (ulong)(pCVar3->super_CordRep).storage[1] << 3; (ulong)bVar1 * 8 != lVar5;
        lVar5 = lVar5 + 8) {
      DumpAll(*(CordRep **)((long)pCVar3->edges_ + lVar5),include_contents,stream,depth + 1);
    }
    std::__cxx11::string::_M_dispose();
  }
  else {
    if (bVar1 < 6) {
      if (bVar1 != 5) goto LAB_00131053;
      poVar2 = std::operator<<(stream,"Extn, len = ");
    }
    else {
      poVar2 = std::operator<<(stream,"Flat, len = ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", cap = ");
      this = CordRep::flat(rep);
      CordRepFlat::Capacity(this);
    }
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    DumpAll::anon_class_16_2_6856332a::operator()(&maybe_dump_data,rep);
  }
LAB_00131053:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void DumpAll(const CordRep* rep,
             bool include_contents,
             std::ostream& stream,
             size_t depth = 0) {
  // Allow for full height trees + substring -> flat / external nodes.
  assert(depth <= CordRepBtree::kMaxDepth + 2);
  std::string sharing = const_cast<CordRep*>(rep)->refcount.IsOne()
                            ? std::string("Private")
                            : absl::StrCat("Shared(", rep->refcount.Get(), ")");
  std::string sptr = absl::StrCat("0x", absl::Hex(rep));

  // Dumps the data contents of `rep` if `include_contents` is true.
  // Always emits a new line character.
  auto maybe_dump_data = [&stream, include_contents](const CordRep* r) {
    if (include_contents) {
      // Allow for up to 60 wide display of content data, which with some
      // indentation and prefix / labels keeps us within roughly 80-100 wide.
      constexpr size_t kMaxDataLength = 60;
      stream << ", data = \""
             << EdgeData(r).substr(0, kMaxDataLength)
             << (r->length > kMaxDataLength ? "\"..." : "\"");
    }
    stream << '\n';
  };

  // For each level, we print the 'shared/private' state and the rep pointer,
  // indented by two spaces per recursive depth.
  stream << std::string(depth * 2, ' ') << sharing << " (" << sptr << ") ";

  if (rep->IsBtree()) {
    const CordRepBtree* node = rep->btree();
    std::string label =
        node->height() ? absl::StrCat("Node(", node->height(), ")") : "Leaf";
    stream << label << ", len = " << node->length
           << ", begin = " << node->begin() << ", end = " << node->end()
           << "\n";
    for (CordRep* edge : node->Edges()) {
      DumpAll(edge, include_contents, stream, depth + 1);
    }
  } else if (rep->tag == SUBSTRING) {
    const CordRepSubstring* substring = rep->substring();
    stream << "Substring, len = " << rep->length
           << ", start = " << substring->start;
    maybe_dump_data(rep);
    DumpAll(substring->child, include_contents, stream, depth + 1);
  } else if (rep->tag >= FLAT) {
    stream << "Flat, len = " << rep->length
           << ", cap = " << rep->flat()->Capacity();
    maybe_dump_data(rep);
  } else if (rep->tag == EXTERNAL) {
    stream << "Extn, len = " << rep->length;
    maybe_dump_data(rep);
  }
}